

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O2

bool wasm::Properties::isSingleConstantExpression(Expression *curr)

{
  Id IVar1;
  bool bVar2;
  
  while( true ) {
    IVar1 = curr->_id;
    if (IVar1 != RefAsId) break;
    if (1 < *(int *)(curr + 1) - 1U) goto LAB_008f625d;
    curr = (Expression *)curr[1].type.id;
  }
  if ((((IVar1 == ConstId) || (IVar1 == RefNullId)) || (IVar1 == RefFuncId)) ||
     (IVar1 == StringConstId)) {
    bVar2 = true;
  }
  else {
LAB_008f625d:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool isSingleConstantExpression(const Expression* curr) {
  if (auto* refAs = curr->dynCast<RefAs>()) {
    if (refAs->op == ExternConvertAny || refAs->op == AnyConvertExtern) {
      return isSingleConstantExpression(refAs->value);
    }
  }
  return curr->is<Const>() || curr->is<RefNull>() || curr->is<RefFunc>() ||
         curr->is<StringConst>();
}